

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zm.c
# Opt level: O3

void zmCreateBarr(qr_o *r,octet *mod,size_t no,void *stack)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  
  r->n = no + 7 >> 3;
  r->no = no;
  r->mod = (word *)(r + 1);
  u64From((u64 *)(r + 1),mod,no);
  r->unity = r->mod + r->n;
  r->mod[r->n] = 1;
  wwSetZero(r->unity + 1,r->n - 1);
  r->params = r->unity + r->n;
  zzRedBarrStart(r->unity + r->n,r->mod,r->n,stack);
  r->from = zmFrom;
  r->to = zmTo;
  r->add = zmAdd2;
  r->sub = zmSub2;
  r->neg = zmNeg2;
  r->mul = zmMulBarr;
  r->sqr = zmSqrBarr;
  r->inv = zmInv;
  r->div = zmDiv;
  sVar1 = zmMulBarr_deep(r->n);
  sVar2 = zmSqrBarr_deep(r->n);
  sVar3 = zzInvMod_deep(r->n);
  sVar4 = zzDivMod_deep(r->n);
  sVar1 = utilMax(4,sVar1,sVar2,sVar3,sVar4);
  r->deep = sVar1;
  (r->hdr).keep = r->n * 0x18 + 0xa0;
  (r->hdr).p_count = 3;
  (r->hdr).o_count = 0;
  return;
}

Assistant:

void zmCreateBarr(qr_o* r, const octet mod[], size_t no, void* stack)
{
	ASSERT(memIsValid(r, sizeof(qr_o)));
	ASSERT(memIsValid(mod, no));
	ASSERT(no > 0 && mod[no - 1] > 0);
	// зафиксировать размерности
	r->n = W_OF_O(no);
	r->no = no;
	// зафиксировать модуль
	r->mod = (word*)r->descr;
	wwFrom(r->mod, mod, no);
	// подготовить единицу
	r->unity = r->mod + r->n;
	r->unity[0] = 1;
	wwSetZero(r->unity + 1, r->n - 1);
	// подготовить параметры
	r->params = r->unity + r->n;
	zzRedBarrStart(r->params, r->mod, r->n, stack);
	// настроить функции
	r->from = zmFrom;
	r->to = zmTo;
	r->add = zmAdd2;
	r->sub = zmSub2;
	r->neg = zmNeg2;
	r->mul = zmMulBarr;
	r->sqr = zmSqrBarr;
	r->inv = zmInv;
	r->div = zmDiv;
	r->deep = utilMax(4,
		zmMulBarr_deep(r->n),
		zmSqrBarr_deep(r->n),
		zmInv_deep(r->n),
		zmDiv_deep(r->n));
	// настроить заголовок
	r->hdr.keep = sizeof(qr_o) + O_OF_W(3 * r->n + 2);
	r->hdr.p_count = 3;
	r->hdr.o_count = 0;
}